

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void test_remove_many(void)

{
  sbs_t *psVar1;
  uint64_t uVar2;
  uint uVar3;
  uint32_t values [8];
  
  psVar1 = sbs_create();
  sbs_add_range(psVar1,0,0x1ffff);
  values[4] = 0x10001;
  values[5] = 0x10003;
  values[6] = 0x10005;
  values[7] = 0x10007;
  values[0] = 1;
  values[1] = 3;
  values[2] = 5;
  values[3] = 7;
  sbs_remove_many(psVar1,8,values);
  sbs_compare(psVar1);
  sbs_free(psVar1);
  psVar1 = sbs_create();
  sbs_add_range(psVar1,0,0x1ffff);
  values[4] = 1;
  values[5] = 0x10001;
  values[6] = 0x10003;
  values[7] = 3;
  values[0] = 0x10007;
  values[1] = 0x10005;
  values[2] = 7;
  values[3] = 5;
  sbs_remove_many(psVar1,8,values);
  sbs_compare(psVar1);
  sbs_free(psVar1);
  psVar1 = sbs_create();
  sbs_add_value(psVar1,500);
  values[0] = 0x1f5;
  values[1] = 80000;
  sbs_remove_many(psVar1,2,values);
  sbs_remove_many(psVar1,0,(uint32_t *)0x0);
  sbs_compare(psVar1);
  sbs_free(psVar1);
  psVar1 = sbs_create();
  sbs_add_range(psVar1,0,0xffff);
  uVar3 = 0;
  while (values[0] = uVar3, uVar3 < 0x10000) {
    sbs_remove_many(psVar1,1,values);
    uVar2 = roaring_bitmap_get_cardinality(psVar1->roaring);
    _assert_true((ulong)(uVar2 == 0xffff - values[0]),
                 "roaring_bitmap_get_cardinality(sbs->roaring) == 65535 - v",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x1175);
    uVar3 = values[0] + 1;
  }
  _assert_true((ulong)((psVar1->roaring->high_low_container).size == 0),"sbs_is_empty(sbs)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x1177);
  sbs_free(psVar1);
  return;
}

Assistant:

DEFINE_TEST(test_remove_many) {
    // multiple values per container (sorted)
    {
        sbs_t *sbs = sbs_create();
        sbs_add_range(sbs, 0, 65536 * 2 - 1);
        uint32_t values[] = {1,         3,         5,         7,
                             65536 + 1, 65536 + 3, 65536 + 5, 65536 + 7};
        sbs_remove_many(sbs, sizeof(values) / sizeof(values[0]), values);
        sbs_compare(sbs);
        sbs_free(sbs);
    }

    // multiple values per container (interleaved)
    {
        sbs_t *sbs = sbs_create();
        sbs_add_range(sbs, 0, 65536 * 2 - 1);
        uint32_t values[] = {65536 + 7, 65536 + 5, 7,         5,
                             1,         65536 + 1, 65536 + 3, 3};
        sbs_remove_many(sbs, sizeof(values) / sizeof(values[0]), values);
        sbs_compare(sbs);
        sbs_free(sbs);
    }

    // no-op checks
    {
        sbs_t *sbs = sbs_create();
        sbs_add_value(sbs, 500);
        uint32_t values[] = {501, 80000};  // non-existent value/container
        sbs_remove_many(sbs, sizeof(values) / sizeof(values[0]), values);
        sbs_remove_many(sbs, 0, NULL);  // NULL ptr is not dereferenced
        sbs_compare(sbs);
        sbs_free(sbs);
    }

    // container type changes and container removal
    {
        sbs_t *sbs = sbs_create();
        sbs_add_range(sbs, 0, 65535);
        for (uint32_t v = 0; v <= 65535; v++) {
            sbs_remove_many(sbs, 1, &v);
            assert_true(roaring_bitmap_get_cardinality(sbs->roaring) ==
                        65535 - v);
        }
        assert_true(sbs_is_empty(sbs));
        sbs_free(sbs);
    }
}